

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

void nni_msgq_run_getq(nni_msgq *mq)

{
  uint uVar1;
  nni_aio *aio;
  nni_aio *aio_00;
  nni_msg *pnVar2;
  size_t count;
  size_t len;
  nni_msg *msg_1;
  nni_msg *msg;
  nni_aio *waio;
  nni_aio *raio;
  nni_msgq *mq_local;
  
  while( true ) {
    while( true ) {
      aio = (nni_aio *)nni_list_first(&mq->mq_aio_getq);
      if (aio == (nni_aio *)0x0) {
        return;
      }
      if (mq->mq_len == 0) break;
      uVar1 = mq->mq_get;
      mq->mq_get = uVar1 + 1;
      pnVar2 = mq->mq_msgs[uVar1];
      if (mq->mq_get == mq->mq_alloc) {
        mq->mq_get = 0;
      }
      mq->mq_len = mq->mq_len - 1;
      nni_aio_list_remove(aio);
      nni_aio_finish_msg(aio,pnVar2);
    }
    aio_00 = (nni_aio *)nni_list_first(&mq->mq_aio_putq);
    if (aio_00 == (nni_aio *)0x0) break;
    pnVar2 = nni_aio_get_msg(aio_00);
    count = nni_msg_len(pnVar2);
    nni_aio_set_msg(aio_00,(nni_msg *)0x0);
    nni_aio_list_remove(aio_00);
    nni_aio_finish(aio_00,NNG_OK,count);
    nni_aio_list_remove(aio);
    nni_aio_finish_msg(aio,pnVar2);
  }
  return;
}

Assistant:

static void
nni_msgq_run_getq(nni_msgq *mq)
{
	nni_aio *raio;

	while ((raio = nni_list_first(&mq->mq_aio_getq)) != NULL) {
		nni_aio *waio;
		// If anything is waiting in the queue, get it first.
		if (mq->mq_len != 0) {
			nni_msg *msg = mq->mq_msgs[mq->mq_get++];
			if (mq->mq_get == mq->mq_alloc) {
				mq->mq_get = 0;
			}
			mq->mq_len--;

			nni_aio_list_remove(raio);
			nni_aio_finish_msg(raio, msg);
			continue;
		}

		// Nothing queued (unbuffered?), maybe a writer is waiting.
		if ((waio = nni_list_first(&mq->mq_aio_putq)) != NULL) {
			nni_msg *msg;
			size_t   len;
			msg = nni_aio_get_msg(waio);
			len = nni_msg_len(msg);

			nni_aio_set_msg(waio, NULL);
			nni_aio_list_remove(waio);
			nni_aio_finish(waio, 0, len);

			nni_aio_list_remove(raio);
			nni_aio_finish_msg(raio, msg);

			continue;
		}

		// No data to get, and no unbuffered writers waiting.  Just
		// wait until something arrives.
		break;
	}
}